

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O1

void __thiscall
ElementsAddressFactory_CheckConfidentialAddressNetType_Test::TestBody
          (ElementsAddressFactory_CheckConfidentialAddressNetType_Test *this)

{
  pointer pAVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __x;
  bool bVar2;
  char *in_R9;
  AssertionResult gtest_ar__7;
  Script script;
  ElementsAddressFactory factory;
  ConfidentialKey confidential_key;
  Pubkey pubkey;
  ElementsConfidentialAddress conf_addr;
  Address addr;
  AssertHelper local_5a8;
  AssertHelper local_5a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  AssertHelper local_590;
  Script local_588;
  AddressFactory local_550;
  undefined1 local_528 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  char local_508 [16];
  pointer local_4f8;
  pointer local_4e0;
  pointer local_4c8;
  TapBranch local_4b0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_438;
  Script local_420;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0 [2];
  Pubkey local_378;
  Pubkey local_360;
  undefined1 local_348 [432];
  Address local_198;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_550,kLiquidV1,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_348);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_348);
  pAVar1 = (pointer)(local_348 + 0x10);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "02adc4593dedbc9f03b87f636491d24965b4becb7bd546eb20cc230a7bb9384c59","");
  cfd::core::Pubkey::Pubkey(&local_378,(string *)local_348);
  if ((pointer)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af","");
  cfd::core::Pubkey::Pubkey(&local_360,(string *)local_348);
  if ((pointer)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  cfd::core::Address::Address(&local_198);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_348);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2pkhAddress((Address *)local_528,&local_550,&local_360);
      cfd::core::Address::operator=(&local_198,(Address *)local_528);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_3e0);
      cfd::core::Script::~Script(&local_420);
      local_4b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_438);
      cfd::core::TapBranch::~TapBranch(&local_4b0);
      if (local_4c8 != (pointer)0x0) {
        operator_delete(local_4c8);
      }
      if (local_4e0 != (pointer)0x0) {
        operator_delete(local_4e0);
      }
      if (local_4f8 != (pointer)0x0) {
        operator_delete(local_4f8);
      }
      if ((char *)local_518._M_allocated_capacity != local_508) {
        operator_delete((void *)local_518._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x174,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_528._0_8_ + 8))();
      }
      local_528._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ElementsAddressFactory::GetConfidentialAddress
                ((ElementsConfidentialAddress *)local_528,&local_198,&local_378);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_348,(ElementsConfidentialAddress *)local_528);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_528);
    }
  }
  else {
    testing::Message::Message((Message *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x175,
               "Expected: conf_addr = factory.GetConfidentialAddress(addr, confidential_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_528._0_8_ + 8))();
      }
      local_528._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                     kMainnet);
  local_588._vptr_Script._0_1_ = !bVar2;
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x176,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                     kTestnet);
  local_588._vptr_Script._0_1_ = !bVar2;
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x177,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                     kRegtest);
  local_588._vptr_Script._0_1_ = !bVar2;
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x178,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_588._vptr_Script._0_1_ =
       cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                 ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                  kLiquidV1);
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (!(bool)local_588._vptr_Script._0_1_) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x179,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                     kElementsRegtest);
  local_588._vptr_Script._0_1_ = !bVar2;
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17a,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                     kCustomChain);
  local_588._vptr_Script._0_1_ = !bVar2;
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17b,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    ((ElementsAddressFactory *)&local_550,(ElementsConfidentialAddress *)local_348,
                     kCustomChain);
  local_588._vptr_Script._0_1_ = !bVar2;
  local_588.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_588,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17c,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a0.data_ + 8))();
      }
      local_5a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_588.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)local_528,kElementsRegtest,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_588);
  __x.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_528 + 0x10);
  local_550.type_ = local_528._8_4_;
  local_550.wit_ver_ = local_528._12_4_;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&local_550.prefix_list_,
            (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            __x.ptr_);
  local_528._0_8_ = &PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             __x.ptr_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_588);
  local_528._0_8_ = __x.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac","");
  cfd::core::Script::Script(&local_588,(string *)local_528);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_ !=
      __x.ptr_) {
    operator_delete((void *)local_528._0_8_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2shAddress((Address *)local_528,&local_550,&local_588);
      cfd::core::Address::operator=(&local_198,(Address *)local_528);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_3e0);
      cfd::core::Script::~Script(&local_420);
      local_4b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_438);
      cfd::core::TapBranch::~TapBranch(&local_4b0);
      if (local_4c8 != (pointer)0x0) {
        operator_delete(local_4c8);
      }
      if (local_4e0 != (pointer)0x0) {
        operator_delete(local_4e0);
      }
      if (local_4f8 != (pointer)0x0) {
        operator_delete(local_4f8);
      }
      if ((char *)local_518._M_allocated_capacity != local_508) {
        operator_delete((void *)local_518._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_528);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x180,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5a0,(Message *)local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_528._0_8_ + 8))();
      }
      local_528._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ElementsAddressFactory::GetConfidentialAddress
                ((ElementsConfidentialAddress *)local_528,&local_198,&local_378);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_348,(ElementsConfidentialAddress *)local_528);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_528);
    }
  }
  else {
    testing::Message::Message((Message *)local_528);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x181,
               "Expected: conf_addr = factory.GetConfidentialAddress(addr, confidential_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5a0,(Message *)local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_528._0_8_ + 8))();
      }
      local_528._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kMainnet);
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_5a0.data_._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x182,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kTestnet);
  local_5a0.data_._0_1_ = (internal)!bVar2;
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x183,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kRegtest);
  local_5a0.data_._0_1_ = (internal)!bVar2;
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x184,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kLiquidV1);
  local_5a0.data_._0_1_ = (internal)!bVar2;
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x185,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5a0.data_._0_1_ =
       (internal)cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kElementsRegtest);
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_5a0.data_._0_1_) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x186,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kCustomChain);
  local_5a0.data_._0_1_ = (internal)!bVar2;
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x187,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_550,&local_198,kCustomChain);
  local_5a0.data_._0_1_ = (internal)!bVar2;
  local_598.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_5a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x188,(char *)local_528._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528._0_8_
        != __x.ptr_) {
      operator_delete((void *)local_528._0_8_);
    }
    if (local_5a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_5a8.data_ + 8))();
      }
      local_5a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::~Script(&local_588);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_348);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_198.format_data_);
  cfd::core::Script::~Script(&local_198.redeem_script_);
  local_198.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_198.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_198.script_tree_.super_TapBranch);
  if (local_198.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.address_._M_dataplus._M_p != &local_198.address_.field_2) {
    operator_delete(local_198.address_._M_dataplus._M_p);
  }
  if (local_360.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_550._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_550.prefix_list_);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CheckConfidentialAddressNetType)
{
  ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  ConfidentialKey confidential_key = ConfidentialKey("02adc4593dedbc9f03b87f636491d24965b4becb7bd546eb20cc230a7bb9384c59");
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  ElementsConfidentialAddress conf_addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_NO_THROW(conf_addr = factory.GetConfidentialAddress(addr, confidential_key));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kNetTypeNum));

  factory = ElementsAddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_NO_THROW(conf_addr = factory.GetConfidentialAddress(addr, confidential_key));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}